

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

bool __thiscall CDirectiveAlignFill::Validate(CDirectiveAlignFill *this,ValidateState *state)

{
  int iVar1;
  bool bVar2;
  int64_t iVar3;
  Architecture *pAVar4;
  long lVar5;
  long *in_RCX;
  long lVar6;
  char **local_30;
  
  iVar3 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar3;
  if ((this->valueExpression).expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
LAB_001711ab:
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 2) {
      iVar3 = this->finalSize;
LAB_001711b9:
      this->finalSize = this->value;
    }
    else {
      bVar2 = isPowerOfTwo(this->value);
      if (!bVar2) {
        Logger::queueError<long>((Logger *)0x1,0x19097b,(char *)&this->value,in_RCX);
        goto LAB_00171292;
      }
      iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
      iVar3 = this->finalSize;
      if (iVar1 == 0) {
        lVar5 = FileManager::getPhysicalAddress(g_fileManager);
      }
      else {
        if (iVar1 == 2) goto LAB_001711b9;
        if (iVar1 != 1) goto LAB_001711c1;
        lVar5 = FileManager::getVirtualAddress(g_fileManager);
      }
      lVar6 = this->value;
      lVar5 = lVar5 % lVar6;
      lVar6 = lVar6 - lVar5;
      if (lVar5 == 0) {
        lVar6 = 0;
      }
      this->finalSize = lVar6;
    }
LAB_001711c1:
    if ((this->fillExpression).expression.
        super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      bVar2 = Expression::evaluateInteger<signed_char>(&this->fillExpression,&this->fillByte);
      if (!bVar2) {
        Logger::printError<>(FatalError,"Invalid fill value");
        goto LAB_00171292;
      }
    }
    pAVar4 = Architecture::current();
    (*pAVar4->_vptr_Architecture[3])(pAVar4);
    FileManager::advanceMemory(g_fileManager,this->finalSize);
    bVar2 = iVar3 != this->finalSize;
  }
  else {
    bVar2 = Expression::evaluateInteger<long>(&this->valueExpression,&this->value);
    if (bVar2) goto LAB_001711ab;
    local_30 = (char **)0x190971;
    if (*(int *)&(this->super_CAssemblerCommand).field_0x14 == 2) {
      local_30 = (char **)0x194002;
    }
    Logger::queueError<char_const*>((Logger *)0x2,0x190966,(char *)&local_30,local_30);
LAB_00171292:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CDirectiveAlignFill::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (valueExpression.isLoaded())
	{
		if (!valueExpression.evaluateInteger(value))
		{
			Logger::queueError(Logger::FatalError, "Invalid %s",mode == Fill ? "size" : "alignment");
			return false;
		}
	}

	if (mode != Fill && !isPowerOfTwo(value))
	{
		Logger::queueError(Logger::Error, "Invalid alignment %d", value);
		return false;
	}

	int64_t oldSize = finalSize;
	int64_t mod;
	switch (mode)
	{
	case AlignVirtual:
		mod = g_fileManager->getVirtualAddress() % value;
		finalSize = mod ? value-mod : 0;
		break;
	case AlignPhysical:
		mod = g_fileManager->getPhysicalAddress() % value;
		finalSize = mod ? value-mod : 0;
		break;
	case Fill:
		finalSize = value;
		break;
	}

	if (fillExpression.isLoaded())
	{
		if (!fillExpression.evaluateInteger(fillByte))
		{
			Logger::printError(Logger::FatalError, "Invalid fill value");
			return false;
		}
	}

	Architecture::current().NextSection();
	g_fileManager->advanceMemory(finalSize);

	bool result = oldSize != finalSize;
	oldSize = finalSize;
	return result;
}